

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseDelphiCoverage::LoadCoverageData
          (cmParseDelphiCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_218;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  ostringstream cmCTestLog_msg;
  size_t numf;
  string path;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmParseDelphiCoverage *this_local;
  
  std::__cxx11::string::string((string *)&numf);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  path.field_2._8_8_ = 0;
  do {
    if (sVar2 <= (ulong)path.field_2._8_8_) {
      this_local._7_1_ = true;
LAB_001de15d:
      std::__cxx11::string::~string((string *)&numf);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,path.field_2._8_8_);
    std::__cxx11::string::operator=((string *)&numf,(string *)pvVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    poVar4 = std::operator<<((ostream *)local_1d8,"Reading HTML File ");
    poVar4 = std::operator<<(poVar4,(string *)&numf);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                 ,0xd9,pcVar5,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    cmsys::SystemTools::GetFilenameLastExtension(&local_218,(string *)&numf);
    bVar1 = std::operator==(&local_218,".html");
    std::__cxx11::string::~string((string *)&local_218);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = ReadDelphiHTML(this,pcVar5);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_001de15d;
      }
    }
    path.field_2._8_8_ = path.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

bool cmParseDelphiCoverage::LoadCoverageData(
  std::vector<std::string> const& files)
{
  size_t i;
  std::string path;
  size_t numf = files.size();
  for (i = 0; i < numf; i++) {
    path = files[i];

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Reading HTML File " << path << std::endl,
                       this->Coverage.Quiet);
    if (cmSystemTools::GetFilenameLastExtension(path) == ".html") {
      if (!this->ReadDelphiHTML(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}